

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float fVar3;
  BBox1f BVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  undefined4 uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  size_t itime;
  unsigned_long uVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar52;
  float fVar55;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar53;
  float fVar57;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar54;
  float fVar56;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar69;
  float fVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar74;
  undefined1 auVar63 [16];
  float fVar70;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar64 [32];
  float fVar71;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar82;
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar81 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar99;
  float fVar100;
  __m128 a;
  float fVar101;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  vfloat4 b1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  float fVar120;
  float fVar121;
  vfloat4 b1_2;
  undefined1 auVar117 [16];
  float fVar122;
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  vfloat4 b0;
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  size_t local_3d8;
  size_t local_3d0;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  anon_class_16_2_07cfa4d6 local_280;
  ulong local_270;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1e8 [32];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_348._8_4_ = 0x7f800000;
  local_348._0_8_ = 0x7f8000007f800000;
  local_348._12_4_ = 0x7f800000;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_348;
  local_338._8_4_ = 0xff800000;
  local_338._0_8_ = 0xff800000ff800000;
  local_338._12_4_ = 0xff800000;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_338;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_348;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_338;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar38._8_8_ = 0;
  auVar38._0_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar38._4_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar61._8_8_ = 0;
  auVar61._0_4_ = time_range->lower;
  auVar61._4_4_ = time_range->upper;
  auVar85 = vcmpps_avx(auVar38,auVar61,1);
  auVar40 = vinsertps_avx(auVar61,auVar38,0x50);
  auVar38 = vinsertps_avx(auVar38,auVar61,0x50);
  local_228 = vblendvps_avx(auVar38,auVar40,auVar85);
  local_218 = vmovshdup_avx(local_228);
  if (local_228._0_4_ <= local_218._0_4_) {
    uVar34 = r->_begin;
    local_3d0 = 0;
    auVar115 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar119 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar89 = ZEXT1664(local_348);
    local_3d8 = k;
    local_328 = local_338;
LAB_00bbd4b3:
    auVar85 = auVar89._0_16_;
    if (uVar34 < r->_end) {
      BVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = BVar4.lower;
      auVar39._4_4_ = BVar4.upper;
      auVar40 = vmovshdup_avx(auVar39);
      auVar40 = vsubps_avx(auVar40,auVar39);
      uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar34);
      uVar27 = (ulong)(uVar5 + 3);
      pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar27 < (pBVar6->super_RawBufferView).num) {
        fVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar38 = ZEXT416((uint)(fVar3 * (((float)local_218._0_4_ - BVar4.lower) / auVar40._0_4_) *
                                         0.99999976));
        auVar38 = vroundss_avx(auVar38,auVar38,10);
        auVar38 = vminss_avx(auVar38,ZEXT416((uint)fVar3));
        auVar40 = ZEXT416((uint)(fVar3 * (((float)local_228._0_4_ - BVar4.lower) / auVar40._0_4_) *
                                         1.0000002));
        auVar40 = vroundss_avx(auVar40,auVar40,9);
        auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,auVar40);
        pBVar7 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 normals.items;
        fVar99 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        local_2d8 = (float)bezier_basis0._5100_8_;
        fStack_2d4 = SUB84(bezier_basis0._5100_8_,4);
        fStack_2d0 = (float)bezier_basis0._5108_8_;
        fStack_2cc = SUB84(bezier_basis0._5108_8_,4);
        fStack_2c8 = (float)bezier_basis0._5116_8_;
        fStack_2c4 = SUB84(bezier_basis0._5116_8_,4);
        fStack_2c0 = (float)bezier_basis0._5124_8_;
        local_2f8 = (float)bezier_basis0._6256_8_;
        fStack_2f4 = SUB84(bezier_basis0._6256_8_,4);
        fStack_2f0 = (float)bezier_basis0._6264_8_;
        fStack_2ec = SUB84(bezier_basis0._6264_8_,4);
        _fStack_240 = bezier_basis0._8576_8_;
        uVar23 = _fStack_240;
        _fStack_238 = bezier_basis0._8584_8_;
        uVar24 = _fStack_238;
        _fStack_230 = bezier_basis0._8592_8_;
        uVar25 = _fStack_230;
        lVar32 = (long)(int)auVar40._0_4_ * 0x38 + 0x10;
        uVar31 = (long)(int)auVar40._0_4_ - 1;
LAB_00bbd61d:
        uVar31 = uVar31 + 1;
        auVar40 = auVar115._0_16_;
        auVar61 = auVar119._0_16_;
        fStack_244 = SUB84(bezier_basis0._8568_8_,4);
        if ((ulong)(long)(int)auVar38._0_4_ < uVar31) {
          local_280.primID = &local_270;
          fVar99 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   super_Geometry.time_range.lower;
          fVar69 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   super_Geometry.time_range.upper - fVar99;
          fVar58 = ((float)local_228._0_4_ - fVar99) / fVar69;
          fVar69 = ((float)local_218._0_4_ - fVar99) / fVar69;
          _local_248 = CONCAT44(fStack_244,fVar58);
          fVar58 = fVar3 * fVar58;
          fVar99 = fVar3 * fVar69;
          auVar61 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
          auVar39 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),10);
          auVar40 = vmaxss_avx(auVar61,ZEXT816(0));
          auVar38 = vminss_avx(auVar39,ZEXT416((uint)fVar3));
          local_268._0_4_ = (undefined4)auVar40._0_4_;
          fVar72 = auVar38._0_4_;
          iVar26 = (int)auVar61._0_4_;
          iVar33 = -1;
          if (-1 < iVar26) {
            iVar33 = iVar26;
          }
          iVar20 = (int)fVar3 + 1;
          if ((int)auVar39._0_4_ < (int)fVar3 + 1) {
            iVar20 = (int)auVar39._0_4_;
          }
          local_280.this = this;
          local_270 = uVar34;
          _fStack_240 = uVar23;
          _fStack_238 = uVar24;
          _fStack_230 = uVar25;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    (&blower0,&local_280,(long)(int)local_268._0_4_);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_280,(long)(int)fVar72);
          fVar58 = fVar58 - auVar40._0_4_;
          if (iVar20 - iVar33 == 1) {
            auVar40 = vmaxss_avx(ZEXT416((uint)fVar58),ZEXT816(0) << 0x40);
            auVar38 = vshufps_avx(auVar40,auVar40,0);
            auVar40 = ZEXT416((uint)(1.0 - auVar40._0_4_));
            auVar40 = vshufps_avx(auVar40,auVar40,0);
            auVar106._0_4_ =
                 auVar38._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar40._0_4_ * blower0.lower.field_0.m128[0];
            auVar106._4_4_ =
                 auVar38._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar40._4_4_ * blower0.lower.field_0.m128[1];
            auVar106._8_4_ =
                 auVar38._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar40._8_4_ * blower0.lower.field_0.m128[2];
            auVar106._12_4_ =
                 auVar38._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar40._12_4_ * blower0.lower.field_0.m128[3];
            auVar125._0_4_ =
                 auVar38._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar40._0_4_ * blower0.upper.field_0.m128[0];
            auVar125._4_4_ =
                 auVar38._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar40._4_4_ * blower0.upper.field_0.m128[1];
            auVar125._8_4_ =
                 auVar38._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar40._8_4_ * blower0.upper.field_0.m128[2];
            auVar125._12_4_ =
                 auVar38._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar40._12_4_ * blower0.upper.field_0.m128[3];
            auVar40 = vmaxss_avx(ZEXT416((uint)(fVar72 - fVar99)),ZEXT816(0) << 0x40);
            auVar38 = vshufps_avx(auVar40,auVar40,0);
            auVar40 = ZEXT416((uint)(1.0 - auVar40._0_4_));
            auVar40 = vshufps_avx(auVar40,auVar40,0);
            auVar80._0_4_ =
                 auVar40._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar38._0_4_ * blower0.lower.field_0.m128[0];
            auVar80._4_4_ =
                 auVar40._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar38._4_4_ * blower0.lower.field_0.m128[1];
            auVar80._8_4_ =
                 auVar40._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar38._8_4_ * blower0.lower.field_0.m128[2];
            auVar80._12_4_ =
                 auVar40._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar38._12_4_ * blower0.lower.field_0.m128[3];
            auVar97._0_4_ =
                 auVar40._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar38._0_4_ * blower0.upper.field_0.m128[0];
            auVar97._4_4_ =
                 auVar40._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar38._4_4_ * blower0.upper.field_0.m128[1];
            auVar97._8_4_ =
                 auVar40._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar38._8_4_ * blower0.upper.field_0.m128[2];
            auVar97._12_4_ =
                 auVar40._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar38._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_280,(long)(local_268._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_280,(long)((int)fVar72 + -1));
            auVar40 = vmaxss_avx(ZEXT416((uint)fVar58),ZEXT816(0) << 0x40);
            auVar38 = vshufps_avx(auVar40,auVar40,0);
            auVar40 = ZEXT416((uint)(1.0 - auVar40._0_4_));
            auVar40 = vshufps_avx(auVar40,auVar40,0);
            auVar106._0_4_ =
                 auVar38._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar40._0_4_ * blower0.lower.field_0.m128[0];
            auVar106._4_4_ =
                 auVar38._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar40._4_4_ * blower0.lower.field_0.m128[1];
            auVar106._8_4_ =
                 auVar38._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar40._8_4_ * blower0.lower.field_0.m128[2];
            auVar106._12_4_ =
                 auVar38._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar40._12_4_ * blower0.lower.field_0.m128[3];
            auVar125._0_4_ =
                 auVar38._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar40._0_4_ * blower0.upper.field_0.m128[0];
            auVar125._4_4_ =
                 auVar38._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar40._4_4_ * blower0.upper.field_0.m128[1];
            auVar125._8_4_ =
                 auVar38._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar40._8_4_ * blower0.upper.field_0.m128[2];
            auVar125._12_4_ =
                 auVar38._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar40._12_4_ * blower0.upper.field_0.m128[3];
            auVar40 = vmaxss_avx(ZEXT416((uint)(fVar72 - fVar99)),ZEXT816(0) << 0x40);
            auVar38 = vshufps_avx(auVar40,auVar40,0);
            auVar40 = ZEXT416((uint)(1.0 - auVar40._0_4_));
            auVar40 = vshufps_avx(auVar40,auVar40,0);
            auVar80._0_4_ =
                 auVar38._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar40._0_4_ * bupper1.lower.field_0.m128[0];
            auVar80._4_4_ =
                 auVar38._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar40._4_4_ * bupper1.lower.field_0.m128[1];
            auVar80._8_4_ =
                 auVar38._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar40._8_4_ * bupper1.lower.field_0.m128[2];
            auVar80._12_4_ =
                 auVar38._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar40._12_4_ * bupper1.lower.field_0.m128[3];
            auVar97._0_4_ =
                 auVar38._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar40._0_4_ * bupper1.upper.field_0.m128[0];
            auVar97._4_4_ =
                 auVar38._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar40._4_4_ * bupper1.upper.field_0.m128[1];
            auVar97._8_4_ =
                 auVar38._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar40._8_4_ * bupper1.upper.field_0.m128[2];
            auVar97._12_4_ =
                 auVar38._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar40._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar26 < 0) {
              iVar26 = -1;
            }
            fVar69 = fVar69 - local_248;
            itime = (size_t)iVar26;
            while (itime = itime + 1, (long)itime < (long)iVar20) {
              auVar46._0_4_ = ((float)(int)itime / fVar3 - local_248) / fVar69;
              auVar46._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar40 = vshufps_avx(auVar46,auVar46,0);
              local_3a8 = auVar80._0_4_;
              fStack_3a4 = auVar80._4_4_;
              fStack_3a0 = auVar80._8_4_;
              fStack_39c = auVar80._12_4_;
              auVar38 = vshufps_avx(ZEXT416((uint)(1.0 - auVar46._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar46._0_4_)),0);
              fVar75 = auVar106._4_4_;
              fVar60 = auVar106._8_4_;
              fVar71 = auVar106._12_4_;
              fVar99 = auVar97._4_4_;
              fVar58 = auVar97._8_4_;
              fVar72 = auVar97._12_4_;
              fVar36 = auVar125._4_4_;
              fVar37 = auVar125._8_4_;
              fVar53 = auVar125._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_280,itime);
              auVar104._4_4_ = auVar40._4_4_ * fStack_3a4 + fVar75 * auVar38._4_4_;
              auVar104._0_4_ = auVar40._0_4_ * local_3a8 + auVar106._0_4_ * auVar38._0_4_;
              auVar104._8_4_ = auVar40._8_4_ * fStack_3a0 + fVar60 * auVar38._8_4_;
              auVar104._12_4_ = auVar40._12_4_ * fStack_39c + fVar71 * auVar38._12_4_;
              auVar61 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar104);
              auVar10._4_4_ = fVar99 * auVar40._4_4_ + fVar36 * auVar38._4_4_;
              auVar10._0_4_ = auVar97._0_4_ * auVar40._0_4_ + auVar125._0_4_ * auVar38._0_4_;
              auVar10._8_4_ = fVar58 * auVar40._8_4_ + fVar37 * auVar38._8_4_;
              auVar10._12_4_ = fVar72 * auVar40._12_4_ + fVar53 * auVar38._12_4_;
              auVar40 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
              auVar38 = vminps_avx(auVar61,ZEXT816(0) << 0x40);
              auVar40 = vmaxps_avx(auVar40,ZEXT816(0) << 0x40);
              auVar106._0_4_ = auVar106._0_4_ + auVar38._0_4_;
              auVar106._4_4_ = fVar75 + auVar38._4_4_;
              auVar106._8_4_ = fVar60 + auVar38._8_4_;
              auVar106._12_4_ = fVar71 + auVar38._12_4_;
              auVar80._0_4_ = local_3a8 + auVar38._0_4_;
              auVar80._4_4_ = fStack_3a4 + auVar38._4_4_;
              auVar80._8_4_ = fStack_3a0 + auVar38._8_4_;
              auVar80._12_4_ = fStack_39c + auVar38._12_4_;
              auVar125._0_4_ = auVar125._0_4_ + auVar40._0_4_;
              auVar125._4_4_ = fVar36 + auVar40._4_4_;
              auVar125._8_4_ = fVar37 + auVar40._8_4_;
              auVar125._12_4_ = fVar53 + auVar40._12_4_;
              auVar97._0_4_ = auVar97._0_4_ + auVar40._0_4_;
              auVar97._4_4_ = fVar99 + auVar40._4_4_;
              auVar97._8_4_ = fVar58 + auVar40._8_4_;
              auVar97._12_4_ = fVar72 + auVar40._12_4_;
            }
          }
          auVar40 = vcmpps_avx(auVar106,auVar125,2);
          uVar29 = vmovmskps_avx(auVar40);
          auVar89 = ZEXT1664(auVar85);
          auVar115 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar119 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          if ((~(byte)uVar29 & 7) == 0) {
            auVar40 = vcmpps_avx(auVar80,auVar97,2);
            uVar29 = vmovmskps_avx(auVar40);
            if ((~(byte)uVar29 & 7) == 0) {
              auVar40 = vminps_avx(auVar106,auVar80);
              aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar40,ZEXT416(geomID),0x30);
              auVar40 = vmaxps_avx(auVar125,auVar97);
              aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar40,ZEXT416((uint)uVar34),0x30);
              auVar40._0_4_ = aVar11.x + aVar12.x;
              auVar40._4_4_ = aVar11.y + aVar12.y;
              auVar40._8_4_ = aVar11.z + aVar12.z;
              auVar40._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
              local_348 = vminps_avx(local_348,(undefined1  [16])aVar11);
              local_338 = vmaxps_avx(local_338,(undefined1  [16])aVar12);
              auVar85 = vminps_avx(auVar85,auVar40);
              auVar89 = ZEXT1664(auVar85);
              local_328 = vmaxps_avx(local_328,auVar40);
              local_3d0 = local_3d0 + 1;
              prims[local_3d8].lower.field_0.field_1 = aVar11;
              prims[local_3d8].upper.field_0.field_1 = aVar12;
              local_3d8 = local_3d8 + 1;
            }
          }
          goto LAB_00bbe3fc;
        }
        lVar8 = *(long *)((long)pBVar6 + lVar32 + -0x10);
        lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar32);
        lVar30 = lVar9 * (ulong)uVar5;
        lVar28 = lVar9 * (ulong)(uVar5 + 1);
        lVar35 = lVar9 * (ulong)(uVar5 + 2);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 0xc + lVar30)),
                                ZEXT416(*(uint *)(lVar8 + 0xc + lVar28)),0x10);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar8 + 0xc + lVar35)),0x20);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar8 + 0xc + lVar9 * uVar27)),0x30);
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx(auVar39,auVar62);
        auVar39 = vcmpps_avx(auVar39,auVar40,5);
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar39[0xf]
           ) {
          auVar39 = *(undefined1 (*) [16])(lVar8 + lVar30);
          auVar80 = vcmpps_avx(auVar39,auVar61,6);
          auVar97 = vcmpps_avx(auVar39,auVar40,1);
          auVar80 = vandps_avx(auVar80,auVar97);
          uVar29 = vmovmskps_avx(auVar80);
          if ((~(byte)uVar29 & 7) == 0) {
            auVar80 = *(undefined1 (*) [16])(lVar8 + lVar28);
            auVar97 = vcmpps_avx(auVar80,auVar61,6);
            auVar106 = vcmpps_avx(auVar80,auVar40,1);
            auVar97 = vandps_avx(auVar97,auVar106);
            uVar29 = vmovmskps_avx(auVar97);
            if ((~(byte)uVar29 & 7) == 0) {
              auVar97 = *(undefined1 (*) [16])(lVar8 + lVar35);
              auVar106 = vcmpps_avx(auVar97,auVar61,6);
              auVar125 = vcmpps_avx(auVar97,auVar40,1);
              auVar106 = vandps_avx(auVar106,auVar125);
              uVar29 = vmovmskps_avx(auVar106);
              if ((~(byte)uVar29 & 7) == 0) {
                auVar106 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar27);
                auVar125 = vcmpps_avx(auVar106,auVar61,6);
                auVar10 = vcmpps_avx(auVar106,auVar40,1);
                auVar125 = vandps_avx(auVar125,auVar10);
                uVar29 = vmovmskps_avx(auVar125);
                if ((~(byte)uVar29 & 7) == 0) {
                  lVar8 = *(long *)((long)pBVar7 + lVar32 + -0x10);
                  lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar32);
                  auVar125 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)uVar5);
                  auVar10 = vcmpps_avx(auVar125,auVar61,6);
                  auVar104 = vcmpps_avx(auVar125,auVar40,1);
                  auVar10 = vandps_avx(auVar10,auVar104);
                  uVar29 = vmovmskps_avx(auVar10);
                  if ((~(byte)uVar29 & 7) == 0) {
                    auVar10 = *(undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar5 + 1));
                    auVar61 = vcmpps_avx(auVar10,auVar61,6);
                    auVar40 = vcmpps_avx(auVar10,auVar40,1);
                    auVar40 = vandps_avx(auVar61,auVar40);
                    uVar29 = vmovmskps_avx(auVar40);
                    if ((~(byte)uVar29 & 7) == 0) goto code_r0x00bbd799;
                  }
                }
              }
            }
          }
        }
        goto LAB_00bbe3f2;
      }
      goto LAB_00bbe3fc;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_348._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_348._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_338._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_338._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar85;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_328._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_328._8_8_;
    __return_storage_ptr__->end = local_3d0;
  }
  return __return_storage_ptr__;
code_r0x00bbd799:
  auVar40 = vshufps_avx(auVar39,auVar39,0xff);
  auVar40 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar99 * auVar40._0_4_)),0x30);
  fVar58 = auVar40._0_4_;
  fVar75 = auVar40._4_4_;
  fVar36 = auVar40._8_4_;
  fVar54 = auVar40._12_4_;
  auVar40 = vshufps_avx(auVar80,auVar80,0xff);
  auVar40 = vinsertps_avx(auVar80,ZEXT416((uint)(fVar99 * auVar40._0_4_)),0x30);
  auVar61 = vshufps_avx(auVar97,auVar97,0xff);
  auVar61 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar99 * auVar61._0_4_)),0x30);
  fVar116 = auVar61._0_4_;
  fVar120 = auVar61._4_4_;
  fVar121 = auVar61._8_4_;
  fVar122 = auVar61._12_4_;
  auVar61 = vshufps_avx(auVar106,auVar106,0xff);
  auVar61 = vinsertps_avx(auVar106,ZEXT416((uint)(fVar99 * auVar61._0_4_)),0x30);
  fVar57 = auVar61._0_4_;
  fVar52 = auVar61._4_4_;
  fVar59 = auVar61._8_4_;
  fVar70 = auVar61._12_4_;
  fVar69 = auVar125._0_4_;
  fVar60 = auVar125._4_4_;
  fVar37 = auVar125._8_4_;
  fVar55 = auVar125._12_4_;
  fVar73 = auVar10._0_4_;
  fVar76 = auVar10._4_4_;
  fVar77 = auVar10._8_4_;
  fVar74 = auVar10._12_4_;
  pauVar1 = (undefined1 (*) [16])(lVar8 + lVar9 * (ulong)(uVar5 + 2));
  auVar125 = *pauVar1;
  pauVar2 = (undefined1 (*) [16])(lVar8 + lVar9 * uVar27);
  auVar10 = *pauVar2;
  fVar134 = *(float *)*pauVar2 * 0.0;
  fVar139 = *(float *)(*pauVar2 + 4) * 0.0;
  fVar140 = *(float *)(*pauVar2 + 8) * 0.0;
  fVar141 = *(float *)(*pauVar2 + 0xc) * 0.0;
  auVar109._0_4_ =
       fVar69 * 0.16666667 + fVar73 * 0.6666667 + *(float *)*pauVar1 * 0.16666667 + fVar134;
  auVar109._4_4_ =
       fVar60 * 0.16666667 + fVar76 * 0.6666667 + *(float *)(*pauVar1 + 4) * 0.16666667 + fVar139;
  auVar109._8_4_ =
       fVar37 * 0.16666667 + fVar77 * 0.6666667 + *(float *)(*pauVar1 + 8) * 0.16666667 + fVar140;
  auVar109._12_4_ =
       fVar55 * 0.16666667 + fVar74 * 0.6666667 + *(float *)(*pauVar1 + 0xc) * 0.16666667 + fVar141;
  auVar90._0_4_ = fVar116 * 0.5 + fVar57 * 0.0;
  auVar90._4_4_ = fVar120 * 0.5 + fVar52 * 0.0;
  auVar90._8_4_ = fVar121 * 0.5 + fVar59 * 0.0;
  auVar90._12_4_ = fVar122 * 0.5 + fVar70 * 0.0;
  fVar83 = auVar40._0_4_;
  auVar123._0_4_ = fVar83 * 0.0;
  fVar84 = auVar40._4_4_;
  auVar123._4_4_ = fVar84 * 0.0;
  fVar100 = auVar40._8_4_;
  auVar123._8_4_ = fVar100 * 0.0;
  fVar101 = auVar40._12_4_;
  auVar123._12_4_ = fVar101 * 0.0;
  auVar40 = vsubps_avx(auVar90,auVar123);
  auVar124._0_4_ = fVar58 * 0.5;
  auVar124._4_4_ = fVar75 * 0.5;
  auVar124._8_4_ = fVar36 * 0.5;
  auVar124._12_4_ = fVar54 * 0.5;
  auVar106 = vsubps_avx(auVar40,auVar124);
  auVar39 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar91._0_4_ = auVar109._0_4_ * auVar39._0_4_;
  auVar91._4_4_ = auVar109._4_4_ * auVar39._4_4_;
  auVar91._8_4_ = auVar109._8_4_ * auVar39._8_4_;
  auVar91._12_4_ = auVar109._12_4_ * auVar39._12_4_;
  auVar40 = vshufps_avx(auVar109,auVar109,0xc9);
  fVar72 = auVar106._0_4_;
  auVar110._0_4_ = auVar40._0_4_ * fVar72;
  fVar71 = auVar106._4_4_;
  auVar110._4_4_ = auVar40._4_4_ * fVar71;
  fVar53 = auVar106._8_4_;
  auVar110._8_4_ = auVar40._8_4_ * fVar53;
  fVar56 = auVar106._12_4_;
  auVar110._12_4_ = auVar40._12_4_ * fVar56;
  auVar40 = vsubps_avx(auVar91,auVar110);
  auVar80 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar80,auVar80,0x7f);
  local_3c8._0_4_ = fVar83 * 0.6666667 + fVar116 * 0.16666667 + fVar57 * 0.0 + fVar58 * 0.16666667;
  local_3c8._4_4_ = fVar84 * 0.6666667 + fVar120 * 0.16666667 + fVar52 * 0.0 + fVar75 * 0.16666667;
  fStack_3c0 = fVar100 * 0.6666667 + fVar121 * 0.16666667 + fVar59 * 0.0 + fVar36 * 0.16666667;
  fStack_3bc = fVar101 * 0.6666667 + fVar122 * 0.16666667 + fVar70 * 0.0 + fVar54 * 0.16666667;
  fVar82 = auVar40._0_4_;
  auVar104 = ZEXT416((uint)fVar82);
  auVar61 = vrsqrtss_avx(auVar104,auVar104);
  fVar144 = auVar61._0_4_;
  auVar129._0_4_ = *(float *)*pauVar1 * 0.5 + fVar134;
  auVar129._4_4_ = *(float *)(*pauVar1 + 4) * 0.5 + fVar139;
  auVar129._8_4_ = *(float *)(*pauVar1 + 8) * 0.5 + fVar140;
  auVar129._12_4_ = *(float *)(*pauVar1 + 0xc) * 0.5 + fVar141;
  auVar135._0_4_ = fVar73 * 0.0;
  auVar135._4_4_ = fVar76 * 0.0;
  auVar135._8_4_ = fVar77 * 0.0;
  auVar135._12_4_ = fVar74 * 0.0;
  auVar61 = vsubps_avx(auVar129,auVar135);
  auVar136._0_4_ = fVar69 * 0.5;
  auVar136._4_4_ = fVar60 * 0.5;
  auVar136._8_4_ = fVar37 * 0.5;
  auVar136._12_4_ = fVar55 * 0.5;
  auVar61 = vsubps_avx(auVar61,auVar136);
  auVar137._0_4_ = auVar61._0_4_ * auVar39._0_4_;
  auVar137._4_4_ = auVar61._4_4_ * auVar39._4_4_;
  auVar137._8_4_ = auVar61._8_4_ * auVar39._8_4_;
  auVar137._12_4_ = auVar61._12_4_ * auVar39._12_4_;
  auVar61 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar130._0_4_ = auVar61._0_4_ * fVar72;
  auVar130._4_4_ = auVar61._4_4_ * fVar71;
  auVar130._8_4_ = auVar61._8_4_ * fVar53;
  auVar130._12_4_ = auVar61._12_4_ * fVar56;
  auVar61 = vsubps_avx(auVar137,auVar130);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar61 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar138._0_4_ = auVar40._0_4_ * auVar61._0_4_;
  auVar138._4_4_ = auVar40._4_4_ * auVar61._4_4_;
  auVar138._8_4_ = auVar40._8_4_ * auVar61._8_4_;
  auVar138._12_4_ = auVar40._12_4_ * auVar61._12_4_;
  auVar40 = vdpps_avx(auVar80,auVar61,0x7f);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar131._0_4_ = auVar40._0_4_ * auVar80._0_4_;
  auVar131._4_4_ = auVar40._4_4_ * auVar80._4_4_;
  auVar131._8_4_ = auVar40._8_4_ * auVar80._8_4_;
  auVar131._12_4_ = auVar40._12_4_ * auVar80._12_4_;
  auVar97 = vsubps_avx(auVar138,auVar131);
  auVar61 = vshufps_avx(_local_3c8,_local_3c8,0xff);
  auVar40 = ZEXT416((uint)(fVar144 * 1.5 - fVar82 * 0.5 * fVar144 * fVar144 * fVar144));
  auVar39 = vshufps_avx(auVar40,auVar40,0);
  fVar134 = auVar80._0_4_ * auVar39._0_4_;
  fVar139 = auVar80._4_4_ * auVar39._4_4_;
  fVar140 = auVar80._8_4_ * auVar39._8_4_;
  fVar141 = auVar80._12_4_ * auVar39._12_4_;
  auVar40 = vrcpss_avx(auVar104,auVar104);
  auVar80 = vshufps_avx(auVar106,auVar106,0xff);
  local_308._0_4_ = auVar61._0_4_ * fVar134;
  local_308._4_4_ = auVar61._4_4_ * fVar139;
  fStack_300 = auVar61._8_4_ * fVar140;
  fStack_2fc = auVar61._12_4_ * fVar141;
  auVar40 = ZEXT416((uint)(auVar40._0_4_ * (2.0 - fVar82 * auVar40._0_4_)));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  local_268._0_4_ =
       fVar134 * auVar80._0_4_ + auVar61._0_4_ * auVar39._0_4_ * auVar97._0_4_ * auVar40._0_4_;
  local_268._4_4_ =
       fVar139 * auVar80._4_4_ + auVar61._4_4_ * auVar39._4_4_ * auVar97._4_4_ * auVar40._4_4_;
  fStack_260 = fVar140 * auVar80._8_4_ +
               auVar61._8_4_ * auVar39._8_4_ * auVar97._8_4_ * auVar40._8_4_;
  fStack_25c = fVar141 * auVar80._12_4_ +
               auVar61._12_4_ * auVar39._12_4_ * auVar97._12_4_ * auVar40._12_4_;
  auVar92._0_4_ = fVar58 * 0.0;
  auVar92._4_4_ = fVar75 * 0.0;
  auVar92._8_4_ = fVar36 * 0.0;
  auVar92._12_4_ = fVar54 * 0.0;
  local_3e8._0_4_ = auVar92._0_4_ + fVar83 * 0.16666667 + fVar57 * 0.16666667 + fVar116 * 0.6666667;
  local_3e8._4_4_ = auVar92._4_4_ + fVar84 * 0.16666667 + fVar52 * 0.16666667 + fVar120 * 0.6666667;
  fStack_3e0 = auVar92._8_4_ + fVar100 * 0.16666667 + fVar59 * 0.16666667 + fVar121 * 0.6666667;
  fStack_3dc = auVar92._12_4_ + fVar101 * 0.16666667 + fVar70 * 0.16666667 + fVar122 * 0.6666667;
  auVar132._0_4_ = fVar69 * 0.0;
  auVar132._4_4_ = fVar60 * 0.0;
  auVar132._8_4_ = fVar37 * 0.0;
  auVar132._12_4_ = fVar55 * 0.0;
  local_208._0_4_ = auVar125._0_4_;
  local_208._4_4_ = auVar125._4_4_;
  fStack_200 = auVar125._8_4_;
  fStack_1fc = auVar125._12_4_;
  local_f8 = auVar10._0_4_;
  fStack_f4 = auVar10._4_4_;
  fStack_f0 = auVar10._8_4_;
  fStack_ec = auVar10._12_4_;
  auVar78._0_4_ =
       auVar132._0_4_ +
       fVar73 * 0.16666667 + local_f8 * 0.16666667 + (float)local_208._0_4_ * 0.6666667;
  auVar78._4_4_ =
       auVar132._4_4_ +
       fVar76 * 0.16666667 + fStack_f4 * 0.16666667 + (float)local_208._4_4_ * 0.6666667;
  auVar78._8_4_ =
       auVar132._8_4_ + fVar77 * 0.16666667 + fStack_f0 * 0.16666667 + fStack_200 * 0.6666667;
  auVar78._12_4_ =
       auVar132._12_4_ + fVar74 * 0.16666667 + fStack_ec * 0.16666667 + fStack_1fc * 0.6666667;
  auVar105._0_4_ = fVar57 * 0.5 + fVar116 * 0.0;
  auVar105._4_4_ = fVar52 * 0.5 + fVar120 * 0.0;
  auVar105._8_4_ = fVar59 * 0.5 + fVar121 * 0.0;
  auVar105._12_4_ = fVar70 * 0.5 + fVar122 * 0.0;
  auVar95._0_4_ = fVar83 * 0.5;
  auVar95._4_4_ = fVar84 * 0.5;
  auVar95._8_4_ = fVar100 * 0.5;
  auVar95._12_4_ = fVar101 * 0.5;
  auVar40 = vsubps_avx(auVar105,auVar95);
  auVar125 = vsubps_avx(auVar40,auVar92);
  auVar39 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar93._0_4_ = auVar39._0_4_ * auVar78._0_4_;
  auVar93._4_4_ = auVar39._4_4_ * auVar78._4_4_;
  auVar93._8_4_ = auVar39._8_4_ * auVar78._8_4_;
  auVar93._12_4_ = auVar39._12_4_ * auVar78._12_4_;
  auVar40 = vshufps_avx(auVar78,auVar78,0xc9);
  fVar37 = auVar125._0_4_;
  auVar79._0_4_ = fVar37 * auVar40._0_4_;
  fVar54 = auVar125._4_4_;
  auVar79._4_4_ = fVar54 * auVar40._4_4_;
  fVar52 = auVar125._8_4_;
  auVar79._8_4_ = fVar52 * auVar40._8_4_;
  fVar82 = auVar125._12_4_;
  auVar79._12_4_ = fVar82 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar93,auVar79);
  auVar80 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar80,auVar80,0x7f);
  fVar60 = auVar40._0_4_;
  auVar96._4_12_ = SUB1612(ZEXT816(0),0);
  auVar96._0_4_ = fVar60;
  auVar61 = vrsqrtss_avx(auVar96,auVar96);
  fVar58 = auVar61._0_4_;
  auVar94._0_4_ = (float)local_3c8._0_4_ + (float)local_308._0_4_;
  auVar94._4_4_ = (float)local_3c8._4_4_ + (float)local_308._4_4_;
  auVar94._8_4_ = fStack_3c0 + fStack_300;
  auVar94._12_4_ = fStack_3bc + fStack_2fc;
  auVar102._0_4_ = (float)local_208._0_4_ * 0.0 + local_f8 * 0.5;
  auVar102._4_4_ = (float)local_208._4_4_ * 0.0 + fStack_f4 * 0.5;
  auVar102._8_4_ = fStack_200 * 0.0 + fStack_f0 * 0.5;
  auVar102._12_4_ = fStack_1fc * 0.0 + fStack_ec * 0.5;
  auVar142._0_4_ = auVar94._0_4_ + ((float)local_268._0_4_ + fVar72) * 0.33333334;
  auVar142._4_4_ = auVar94._4_4_ + ((float)local_268._4_4_ + fVar71) * 0.33333334;
  auVar142._8_4_ = auVar94._8_4_ + (fStack_260 + fVar53) * 0.33333334;
  auVar142._12_4_ = auVar94._12_4_ + (fStack_25c + fVar56) * 0.33333334;
  auVar63._0_4_ = fVar73 * 0.5;
  auVar63._4_4_ = fVar76 * 0.5;
  auVar63._8_4_ = fVar77 * 0.5;
  auVar63._12_4_ = fVar74 * 0.5;
  auVar10 = vsubps_avx(auVar102,auVar63);
  auVar61 = vshufps_avx(_local_3e8,_local_3e8,0xff);
  auVar97 = ZEXT416((uint)(fVar58 * 1.5 - fVar60 * 0.5 * fVar58 * fVar58 * fVar58));
  auVar97 = vshufps_avx(auVar97,auVar97,0);
  auVar10 = vsubps_avx(auVar10,auVar132);
  fVar58 = auVar97._0_4_ * auVar80._0_4_;
  fVar69 = auVar97._4_4_ * auVar80._4_4_;
  fVar72 = auVar97._8_4_ * auVar80._8_4_;
  fVar75 = auVar97._12_4_ * auVar80._12_4_;
  auVar111._0_4_ = auVar39._0_4_ * auVar10._0_4_;
  auVar111._4_4_ = auVar39._4_4_ * auVar10._4_4_;
  auVar111._8_4_ = auVar39._8_4_ * auVar10._8_4_;
  auVar111._12_4_ = auVar39._12_4_ * auVar10._12_4_;
  auVar39 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar41._0_4_ = fVar37 * auVar39._0_4_;
  auVar41._4_4_ = fVar54 * auVar39._4_4_;
  auVar41._8_4_ = fVar52 * auVar39._8_4_;
  auVar41._12_4_ = fVar82 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar111,auVar41);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar39 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar112._0_4_ = auVar40._0_4_ * auVar39._0_4_;
  auVar112._4_4_ = auVar40._4_4_ * auVar39._4_4_;
  auVar112._8_4_ = auVar40._8_4_ * auVar39._8_4_;
  auVar112._12_4_ = auVar40._12_4_ * auVar39._12_4_;
  auVar40 = vdpps_avx(auVar80,auVar39,0x7f);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar42._0_4_ = auVar40._0_4_ * auVar80._0_4_;
  auVar42._4_4_ = auVar40._4_4_ * auVar80._4_4_;
  auVar42._8_4_ = auVar40._8_4_ * auVar80._8_4_;
  auVar42._12_4_ = auVar40._12_4_ * auVar80._12_4_;
  auVar39 = vshufps_avx(auVar125,auVar125,0xff);
  fVar59 = auVar61._0_4_ * fVar58;
  fVar70 = auVar61._4_4_ * fVar69;
  fVar73 = auVar61._8_4_ * fVar72;
  fVar76 = auVar61._12_4_ * fVar75;
  auVar80 = vsubps_avx(auVar112,auVar42);
  auVar145._0_4_ = (float)local_3e8._0_4_ + fVar59;
  auVar145._4_4_ = (float)local_3e8._4_4_ + fVar70;
  auVar145._8_4_ = fStack_3e0 + fVar73;
  auVar145._12_4_ = fStack_3dc + fVar76;
  auVar40 = vrcpss_avx(auVar96,auVar96);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ * (2.0 - fVar60 * auVar40._0_4_)));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  fVar36 = auVar39._0_4_ * fVar58 + auVar61._0_4_ * auVar97._0_4_ * auVar80._0_4_ * auVar40._0_4_;
  fVar53 = auVar39._4_4_ * fVar69 + auVar61._4_4_ * auVar97._4_4_ * auVar80._4_4_ * auVar40._4_4_;
  fVar55 = auVar39._8_4_ * fVar72 + auVar61._8_4_ * auVar97._8_4_ * auVar80._8_4_ * auVar40._8_4_;
  fVar57 = auVar39._12_4_ * fVar75 +
           auVar61._12_4_ * auVar97._12_4_ * auVar80._12_4_ * auVar40._12_4_;
  auVar43._0_4_ = (fVar37 + fVar36) * 0.33333334;
  auVar43._4_4_ = (fVar54 + fVar53) * 0.33333334;
  auVar43._8_4_ = (fVar52 + fVar55) * 0.33333334;
  auVar43._12_4_ = (fVar82 + fVar57) * 0.33333334;
  auVar39 = vsubps_avx(auVar145,auVar43);
  auVar40 = vshufps_avx(auVar39,auVar39,0xaa);
  local_388 = (float)bezier_basis0._2788_8_;
  fStack_384 = SUB84(bezier_basis0._2788_8_,4);
  fStack_380 = (float)bezier_basis0._2796_8_;
  fStack_37c = SUB84(bezier_basis0._2796_8_,4);
  fStack_378 = (float)bezier_basis0._2804_8_;
  fStack_374 = SUB84(bezier_basis0._2804_8_,4);
  fStack_370 = (float)bezier_basis0._2812_8_;
  fVar37 = auVar40._0_4_;
  fVar54 = auVar40._4_4_;
  fVar56 = auVar40._8_4_;
  fVar52 = auVar40._12_4_;
  auVar40 = vshufps_avx(auVar145,auVar145,0xaa);
  local_2b8 = (float)bezier_basis0._3944_8_;
  fStack_2b4 = SUB84(bezier_basis0._3944_8_,4);
  fStack_2b0 = (float)bezier_basis0._3952_8_;
  fStack_2ac = SUB84(bezier_basis0._3952_8_,4);
  fStack_2a8 = (float)bezier_basis0._3960_8_;
  fStack_2a4 = SUB84(bezier_basis0._3960_8_,4);
  fStack_2a0 = (float)bezier_basis0._3968_8_;
  fStack_29c = SUB84(bezier_basis0._3968_8_,4);
  fVar74 = auVar40._0_4_;
  fVar82 = auVar40._4_4_;
  fVar83 = auVar40._8_4_;
  fVar84 = auVar40._12_4_;
  auVar40 = vshufps_avx(auVar142,auVar142,0xaa);
  local_368 = (float)bezier_basis0._1632_8_;
  fStack_364 = SUB84(bezier_basis0._1632_8_,4);
  fStack_360 = (float)bezier_basis0._1640_8_;
  fStack_35c = SUB84(bezier_basis0._1640_8_,4);
  fStack_358 = (float)bezier_basis0._1648_8_;
  fStack_354 = SUB84(bezier_basis0._1648_8_,4);
  fStack_350 = (float)bezier_basis0._1656_8_;
  fStack_34c = SUB84(bezier_basis0._1656_8_,4);
  fVar58 = auVar40._0_4_;
  fVar72 = auVar40._4_4_;
  fVar60 = auVar40._8_4_;
  fVar77 = fStack_29c + 0.0;
  auVar61 = vshufps_avx(auVar94,auVar94,0xaa);
  local_b8 = (float)bezier_basis0._476_8_;
  fStack_b4 = SUB84(bezier_basis0._476_8_,4);
  fStack_b0 = (float)bezier_basis0._484_8_;
  fStack_ac = SUB84(bezier_basis0._484_8_,4);
  fStack_a8 = (float)bezier_basis0._492_8_;
  fStack_a4 = SUB84(bezier_basis0._492_8_,4);
  fStack_a0 = (float)bezier_basis0._500_8_;
  fStack_9c = SUB84(bezier_basis0._500_8_,4);
  fVar69 = auVar61._0_4_;
  fVar75 = auVar61._4_4_;
  fVar71 = auVar61._8_4_;
  auVar86._0_4_ = local_b8 * fVar69 + local_368 * fVar58 + fVar37 * local_388 + fVar74 * local_2b8;
  auVar86._4_4_ =
       fStack_b4 * fVar75 + fStack_364 * fVar72 + fVar54 * fStack_384 + fVar82 * fStack_2b4;
  auVar86._8_4_ =
       fStack_b0 * fVar71 + fStack_360 * fVar60 + fVar56 * fStack_380 + fVar83 * fStack_2b0;
  auVar86._12_4_ =
       fStack_ac * auVar61._12_4_ +
       fStack_35c * auVar40._12_4_ + fVar52 * fStack_37c + fVar84 * fStack_2ac;
  auVar86._16_4_ =
       fStack_a8 * fVar69 + fStack_358 * fVar58 + fVar37 * fStack_378 + fVar74 * fStack_2a8;
  auVar86._20_4_ =
       fStack_a4 * fVar75 + fStack_354 * fVar72 + fVar54 * fStack_374 + fVar82 * fStack_2a4;
  auVar86._24_4_ =
       fStack_a0 * fVar71 + fStack_350 * fVar60 + fVar56 * fStack_370 + fVar83 * fStack_2a0;
  auVar86._28_4_ = fStack_34c + fVar77;
  local_3a8 = (float)bezier_basis0._7412_8_;
  fStack_3a4 = SUB84(bezier_basis0._7412_8_,4);
  fStack_3a0 = (float)bezier_basis0._7420_8_;
  fStack_39c = SUB84(bezier_basis0._7420_8_,4);
  fStack_398 = (float)bezier_basis0._7428_8_;
  fStack_394 = SUB84(bezier_basis0._7428_8_,4);
  fStack_390 = (float)bezier_basis0._7436_8_;
  local_248 = (float)bezier_basis0._8568_8_;
  fStack_240 = (float)bezier_basis0._8576_8_;
  fStack_23c = SUB84(bezier_basis0._8576_8_,4);
  fStack_238 = (float)bezier_basis0._8584_8_;
  fStack_234 = SUB84(bezier_basis0._8584_8_,4);
  fStack_230 = (float)bezier_basis0._8592_8_;
  fStack_2e8 = (float)bezier_basis0._6272_8_;
  fStack_2e4 = SUB84(bezier_basis0._6272_8_,4);
  fStack_2e0 = (float)bezier_basis0._6280_8_;
  auVar64._8_4_ = 0xff800000;
  auVar64._0_8_ = 0xff800000ff800000;
  auVar64._12_4_ = 0xff800000;
  auVar64._16_4_ = 0xff800000;
  auVar64._20_4_ = 0xff800000;
  auVar64._24_4_ = 0xff800000;
  auVar64._28_4_ = 0xff800000;
  auVar64 = vmaxps_avx(auVar64,auVar86);
  auVar47._0_4_ = fVar69 * local_2d8 + fVar58 * local_2f8 + fVar37 * local_3a8 + fVar74 * local_248;
  auVar47._4_4_ =
       fVar75 * fStack_2d4 + fVar72 * fStack_2f4 + fVar54 * fStack_3a4 + fVar82 * fStack_244;
  auVar47._8_4_ =
       fVar71 * fStack_2d0 + fVar60 * fStack_2f0 + fVar56 * fStack_3a0 + fVar83 * fStack_240;
  auVar47._12_4_ =
       auVar61._12_4_ * fStack_2cc +
       auVar40._12_4_ * fStack_2ec + fVar52 * fStack_39c + fVar84 * fStack_23c;
  auVar47._16_4_ =
       fVar69 * fStack_2c8 + fVar58 * fStack_2e8 + fVar37 * fStack_398 + fVar74 * fStack_238;
  auVar47._20_4_ =
       fVar75 * fStack_2c4 + fVar72 * fStack_2e4 + fVar54 * fStack_394 + fVar82 * fStack_234;
  auVar47._24_4_ =
       fVar71 * fStack_2c0 + fVar60 * fStack_2e0 + fVar56 * fStack_390 + fVar83 * fStack_230;
  auVar47._28_4_ = fVar84 + fVar77 + fVar52 + fVar77;
  auVar49 = vblendps_avx(auVar47,ZEXT832(0) << 0x20,1);
  auVar13._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar13._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar13._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar13._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar13._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar13._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar13._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar13._28_4_ = auVar49._28_4_;
  auVar15 = vsubps_avx(auVar86,auVar13);
  auVar49 = vblendps_avx(auVar47,ZEXT832(0) << 0x20,0x80);
  auVar48._0_4_ = auVar86._0_4_ + auVar49._0_4_ * 0.055555556;
  auVar48._4_4_ = auVar86._4_4_ + auVar49._4_4_ * 0.055555556;
  auVar48._8_4_ = auVar86._8_4_ + auVar49._8_4_ * 0.055555556;
  auVar48._12_4_ = auVar86._12_4_ + auVar49._12_4_ * 0.055555556;
  auVar48._16_4_ = auVar86._16_4_ + auVar49._16_4_ * 0.055555556;
  auVar48._20_4_ = auVar86._20_4_ + auVar49._20_4_ * 0.055555556;
  auVar48._24_4_ = auVar86._24_4_ + auVar49._24_4_ * 0.055555556;
  auVar48._28_4_ = auVar86._28_4_ + auVar49._28_4_;
  auVar49 = vmaxps_avx(auVar15,auVar48);
  auVar64 = vmaxps_avx(auVar64,auVar49);
  auVar40 = vshufps_avx(auVar39,auVar39,0x55);
  auVar61 = vshufps_avx(auVar145,auVar145,0x55);
  fVar60 = auVar40._0_4_;
  fVar71 = auVar40._4_4_;
  fVar37 = auVar40._8_4_;
  fVar54 = auVar40._12_4_;
  fVar58 = auVar61._0_4_;
  fVar69 = auVar61._4_4_;
  fVar72 = auVar61._8_4_;
  fVar75 = auVar61._12_4_;
  auVar40 = vshufps_avx(auVar142,auVar142,0x55);
  fVar56 = auVar40._0_4_;
  fVar52 = auVar40._4_4_;
  fVar77 = auVar40._8_4_;
  auVar61 = vshufps_avx(auVar94,auVar94,0x55);
  fVar74 = auVar61._0_4_;
  fVar82 = auVar61._4_4_;
  fVar83 = auVar61._8_4_;
  auVar118._0_4_ = fVar74 * local_b8 + fVar56 * local_368 + local_2b8 * fVar58 + fVar60 * local_388;
  auVar118._4_4_ =
       fVar82 * fStack_b4 + fVar52 * fStack_364 + fStack_2b4 * fVar69 + fVar71 * fStack_384;
  auVar118._8_4_ =
       fVar83 * fStack_b0 + fVar77 * fStack_360 + fStack_2b0 * fVar72 + fVar37 * fStack_380;
  auVar118._12_4_ =
       auVar61._12_4_ * fStack_ac +
       auVar40._12_4_ * fStack_35c + fStack_2ac * fVar75 + fVar54 * fStack_37c;
  auVar118._16_4_ =
       fVar74 * fStack_a8 + fVar56 * fStack_358 + fStack_2a8 * fVar58 + fVar60 * fStack_378;
  auVar118._20_4_ =
       fVar82 * fStack_a4 + fVar52 * fStack_354 + fStack_2a4 * fVar69 + fVar71 * fStack_374;
  auVar118._24_4_ =
       fVar83 * fStack_a0 + fVar77 * fStack_350 + fStack_2a0 * fVar72 + fVar37 * fStack_370;
  auVar118._28_4_ = fStack_29c + fStack_34c + 0.0 + 0.0;
  auVar65._0_4_ = fVar74 * local_2d8 + fVar56 * local_2f8 + local_3a8 * fVar60 + fVar58 * local_248;
  auVar65._4_4_ =
       fVar82 * fStack_2d4 + fVar52 * fStack_2f4 + fStack_3a4 * fVar71 + fVar69 * fStack_244;
  auVar65._8_4_ =
       fVar83 * fStack_2d0 + fVar77 * fStack_2f0 + fStack_3a0 * fVar37 + fVar72 * fStack_240;
  auVar65._12_4_ =
       auVar61._12_4_ * fStack_2cc +
       auVar40._12_4_ * fStack_2ec + fStack_39c * fVar54 + fVar75 * fStack_23c;
  auVar65._16_4_ =
       fVar74 * fStack_2c8 + fVar56 * fStack_2e8 + fStack_398 * fVar60 + fVar58 * fStack_238;
  auVar65._20_4_ =
       fVar82 * fStack_2c4 + fVar52 * fStack_2e4 + fStack_394 * fVar71 + fVar69 * fStack_234;
  auVar65._24_4_ =
       fVar83 * fStack_2c0 + fVar77 * fStack_2e0 + fStack_390 * fVar37 + fVar72 * fStack_230;
  auVar65._28_4_ = fVar75 + fVar75 + fVar54 + fVar75;
  auVar49 = vblendps_avx(auVar65,ZEXT832(0) << 0x20,1);
  auVar14._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar14._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar14._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar14._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar14._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar14._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar14._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar14._28_4_ = auVar49._28_4_;
  auVar47 = vsubps_avx(auVar118,auVar14);
  auVar49 = vblendps_avx(auVar65,ZEXT832(0) << 0x20,0x80);
  auVar66._0_4_ = auVar118._0_4_ + auVar49._0_4_ * 0.055555556;
  auVar66._4_4_ = auVar118._4_4_ + auVar49._4_4_ * 0.055555556;
  auVar66._8_4_ = auVar118._8_4_ + auVar49._8_4_ * 0.055555556;
  auVar66._12_4_ = auVar118._12_4_ + auVar49._12_4_ * 0.055555556;
  auVar66._16_4_ = auVar118._16_4_ + auVar49._16_4_ * 0.055555556;
  auVar66._20_4_ = auVar118._20_4_ + auVar49._20_4_ * 0.055555556;
  auVar66._24_4_ = auVar118._24_4_ + auVar49._24_4_ * 0.055555556;
  auVar66._28_4_ = auVar118._28_4_ + auVar49._28_4_;
  auVar126._8_4_ = 0xff800000;
  auVar126._0_8_ = 0xff800000ff800000;
  auVar126._12_4_ = 0xff800000;
  auVar126._16_4_ = 0xff800000;
  auVar126._20_4_ = 0xff800000;
  auVar126._24_4_ = 0xff800000;
  auVar126._28_4_ = 0xff800000;
  auVar49 = vmaxps_avx(auVar126,auVar118);
  auVar13 = vmaxps_avx(auVar47,auVar66);
  auVar14 = vmaxps_avx(auVar49,auVar13);
  auVar40 = vshufps_avx(auVar39,auVar39,0);
  auVar61 = vshufps_avx(auVar145,auVar145,0);
  fVar56 = auVar40._0_4_;
  fVar52 = auVar40._4_4_;
  fVar77 = auVar40._8_4_;
  fVar74 = auVar40._12_4_;
  fVar82 = auVar61._0_4_;
  fVar83 = auVar61._4_4_;
  fVar84 = auVar61._8_4_;
  fVar100 = auVar61._12_4_;
  auVar40 = vpermilps_avx(auVar142,0);
  fVar60 = auVar40._0_4_;
  fVar71 = auVar40._4_4_;
  fVar37 = auVar40._8_4_;
  fVar54 = auVar40._12_4_;
  auVar40 = vpermilps_avx(auVar94,0);
  fVar58 = auVar40._0_4_;
  fVar69 = auVar40._4_4_;
  fVar72 = auVar40._8_4_;
  fVar75 = auVar40._12_4_;
  auVar133._0_4_ = local_b8 * fVar58 + fVar60 * local_368 + fVar56 * local_388 + fVar82 * local_2b8;
  auVar133._4_4_ =
       fStack_b4 * fVar69 + fVar71 * fStack_364 + fVar52 * fStack_384 + fVar83 * fStack_2b4;
  auVar133._8_4_ =
       fStack_b0 * fVar72 + fVar37 * fStack_360 + fVar77 * fStack_380 + fVar84 * fStack_2b0;
  auVar133._12_4_ =
       fStack_ac * fVar75 + fVar54 * fStack_35c + fVar74 * fStack_37c + fVar100 * fStack_2ac;
  auVar133._16_4_ =
       fStack_a8 * fVar58 + fVar60 * fStack_358 + fVar56 * fStack_378 + fVar82 * fStack_2a8;
  auVar133._20_4_ =
       fStack_a4 * fVar69 + fVar71 * fStack_354 + fVar52 * fStack_374 + fVar83 * fStack_2a4;
  auVar133._24_4_ =
       fStack_a0 * fVar72 + fVar37 * fStack_350 + fVar77 * fStack_370 + fVar84 * fStack_2a0;
  auVar133._28_4_ = auVar13._28_4_ + 0.0 + 0.0 + 0.0;
  auVar87._0_4_ = fVar58 * local_2d8 + fVar56 * local_3a8 + fVar82 * local_248 + fVar60 * local_2f8;
  auVar87._4_4_ =
       fVar69 * fStack_2d4 + fVar52 * fStack_3a4 + fVar83 * fStack_244 + fVar71 * fStack_2f4;
  auVar87._8_4_ =
       fVar72 * fStack_2d0 + fVar77 * fStack_3a0 + fVar84 * fStack_240 + fVar37 * fStack_2f0;
  auVar87._12_4_ =
       fVar75 * fStack_2cc + fVar74 * fStack_39c + fVar100 * fStack_23c + fVar54 * fStack_2ec;
  auVar87._16_4_ =
       fVar58 * fStack_2c8 + fVar56 * fStack_398 + fVar82 * fStack_238 + fVar60 * fStack_2e8;
  auVar87._20_4_ =
       fVar69 * fStack_2c4 + fVar52 * fStack_394 + fVar83 * fStack_234 + fVar71 * fStack_2e4;
  auVar87._24_4_ =
       fVar72 * fStack_2c0 + fVar77 * fStack_390 + fVar84 * fStack_230 + fVar37 * fStack_2e0;
  auVar87._28_4_ = fVar75 + fVar74 + fVar100 + fVar54;
  auVar49 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,1);
  auVar16._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar49._28_4_;
  auVar16 = vsubps_avx(auVar133,auVar16);
  auVar49 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  auVar88._0_4_ = auVar133._0_4_ + auVar49._0_4_ * 0.055555556;
  auVar88._4_4_ = auVar133._4_4_ + auVar49._4_4_ * 0.055555556;
  auVar88._8_4_ = auVar133._8_4_ + auVar49._8_4_ * 0.055555556;
  auVar88._12_4_ = auVar133._12_4_ + auVar49._12_4_ * 0.055555556;
  auVar88._16_4_ = auVar133._16_4_ + auVar49._16_4_ * 0.055555556;
  auVar88._20_4_ = auVar133._20_4_ + auVar49._20_4_ * 0.055555556;
  auVar88._24_4_ = auVar133._24_4_ + auVar49._24_4_ * 0.055555556;
  auVar88._28_4_ = auVar133._28_4_ + auVar49._28_4_;
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar49 = vmaxps_avx(auVar49,auVar133);
  auVar13 = vmaxps_avx(auVar16,auVar88);
  _local_208 = vmaxps_avx(auVar49,auVar13);
  auVar49 = vminps_avx(auVar15,auVar48);
  auVar98._8_4_ = 0x7f800000;
  auVar98._0_8_ = 0x7f8000007f800000;
  auVar98._12_4_ = 0x7f800000;
  auVar98._16_4_ = 0x7f800000;
  auVar98._20_4_ = 0x7f800000;
  auVar98._24_4_ = 0x7f800000;
  auVar98._28_4_ = 0x7f800000;
  auVar13 = vminps_avx(auVar98,auVar86);
  auVar15 = vminps_avx(auVar13,auVar49);
  auVar49 = vminps_avx(auVar47,auVar66);
  auVar47 = vminps_avx(auVar98,auVar118);
  auVar47 = vminps_avx(auVar47,auVar49);
  auVar49 = vminps_avx(auVar98,auVar133);
  auVar16 = vminps_avx(auVar16,auVar88);
  auVar16 = vminps_avx(auVar49,auVar16);
  auVar80 = vsubps_avx(_local_3c8,_local_308);
  auVar40 = vshufps_avx(auVar80,auVar80,0);
  auVar61 = vsubps_avx(auVar106,_local_268);
  auVar44._0_4_ = auVar80._0_4_ + auVar61._0_4_ * 0.33333334;
  auVar44._4_4_ = auVar80._4_4_ + auVar61._4_4_ * 0.33333334;
  auVar44._8_4_ = auVar80._8_4_ + auVar61._8_4_ * 0.33333334;
  auVar44._12_4_ = auVar80._12_4_ + auVar61._12_4_ * 0.33333334;
  auVar61 = vshufps_avx(auVar44,auVar44,0);
  auVar22._4_4_ = fVar70;
  auVar22._0_4_ = fVar59;
  auVar22._8_4_ = fVar73;
  auVar22._12_4_ = fVar76;
  auVar97 = vsubps_avx(_local_3e8,auVar22);
  auVar21._4_4_ = fVar53;
  auVar21._0_4_ = fVar36;
  auVar21._8_4_ = fVar55;
  auVar21._12_4_ = fVar57;
  auVar39 = vsubps_avx(auVar125,auVar21);
  auVar45._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar45._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar45._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar45._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar106 = vsubps_avx(auVar97,auVar45);
  auVar39 = vshufps_avx(auVar106,auVar106,0);
  fVar54 = auVar39._0_4_;
  fVar55 = auVar39._4_4_;
  fVar56 = auVar39._8_4_;
  fVar57 = auVar39._12_4_;
  auVar39 = vshufps_avx(auVar97,auVar97,0);
  fVar52 = auVar39._0_4_;
  fVar59 = auVar39._4_4_;
  fVar70 = auVar39._8_4_;
  fVar73 = auVar39._12_4_;
  fVar53 = auVar13._28_4_;
  fVar58 = auVar61._0_4_;
  fVar72 = auVar61._4_4_;
  fVar60 = auVar61._8_4_;
  fVar36 = auVar61._12_4_;
  fVar69 = auVar40._0_4_;
  fVar75 = auVar40._4_4_;
  fVar71 = auVar40._8_4_;
  fVar37 = auVar40._12_4_;
  auVar114._0_4_ = local_b8 * fVar69 + local_368 * fVar58 + fVar54 * local_388 + fVar52 * local_2b8;
  auVar114._4_4_ =
       fStack_b4 * fVar75 + fStack_364 * fVar72 + fVar55 * fStack_384 + fVar59 * fStack_2b4;
  auVar114._8_4_ =
       fStack_b0 * fVar71 + fStack_360 * fVar60 + fVar56 * fStack_380 + fVar70 * fStack_2b0;
  auVar114._12_4_ =
       fStack_ac * fVar37 + fStack_35c * fVar36 + fVar57 * fStack_37c + fVar73 * fStack_2ac;
  auVar114._16_4_ =
       fStack_a8 * fVar69 + fStack_358 * fVar58 + fVar54 * fStack_378 + fVar52 * fStack_2a8;
  auVar114._20_4_ =
       fStack_a4 * fVar75 + fStack_354 * fVar72 + fVar55 * fStack_374 + fVar59 * fStack_2a4;
  auVar114._24_4_ =
       fStack_a0 * fVar71 + fStack_350 * fVar60 + fVar56 * fStack_370 + fVar70 * fStack_2a0;
  auVar114._28_4_ = fVar53 + fVar53 + fVar53 + 0.0;
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  auVar50._16_4_ = 0xff800000;
  auVar50._20_4_ = 0xff800000;
  auVar50._24_4_ = 0xff800000;
  auVar50._28_4_ = 0xff800000;
  auVar13 = vmaxps_avx(auVar50,auVar114);
  auVar67._0_4_ = local_2d8 * fVar69 + local_2f8 * fVar58 + local_3a8 * fVar54 + fVar52 * local_248;
  auVar67._4_4_ =
       fStack_2d4 * fVar75 + fStack_2f4 * fVar72 + fStack_3a4 * fVar55 + fVar59 * fStack_244;
  auVar67._8_4_ =
       fStack_2d0 * fVar71 + fStack_2f0 * fVar60 + fStack_3a0 * fVar56 + fVar70 * fStack_240;
  auVar67._12_4_ =
       fStack_2cc * fVar37 + fStack_2ec * fVar36 + fStack_39c * fVar57 + fVar73 * fStack_23c;
  auVar67._16_4_ =
       fStack_2c8 * fVar69 + fStack_2e8 * fVar58 + fStack_398 * fVar54 + fVar52 * fStack_238;
  auVar67._20_4_ =
       fStack_2c4 * fVar75 + fStack_2e4 * fVar72 + fStack_394 * fVar55 + fVar59 * fStack_234;
  auVar67._24_4_ =
       fStack_2c0 * fVar71 + fStack_2e0 * fVar60 + fStack_390 * fVar56 + fVar70 * fStack_230;
  auVar67._28_4_ = fVar37 + fVar36 + fVar57 + fVar73;
  auVar49 = vblendps_avx(auVar67,ZEXT832(0) << 0x20,1);
  auVar17._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar17._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar17._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar17._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar17._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar17._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar17._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar17._28_4_ = auVar49._28_4_;
  local_1e8 = vsubps_avx(auVar114,auVar17);
  auVar49 = vblendps_avx(auVar67,ZEXT832(0) << 0x20,0x80);
  local_268._0_4_ = auVar114._0_4_ + auVar49._0_4_ * 0.055555556;
  local_268._4_4_ = auVar114._4_4_ + auVar49._4_4_ * 0.055555556;
  fStack_260 = auVar114._8_4_ + auVar49._8_4_ * 0.055555556;
  fStack_25c = auVar114._12_4_ + auVar49._12_4_ * 0.055555556;
  register0x00001250 = auVar114._16_4_ + auVar49._16_4_ * 0.055555556;
  register0x00001254 = auVar114._20_4_ + auVar49._20_4_ * 0.055555556;
  register0x00001258 = auVar114._24_4_ + auVar49._24_4_ * 0.055555556;
  register0x0000125c = auVar114._28_4_ + auVar49._28_4_;
  auVar49 = vmaxps_avx(local_1e8,_local_268);
  auVar49 = vmaxps_avx(auVar13,auVar49);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar40 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar61 = vshufps_avx(auVar106,auVar106,0x55);
  auVar39 = vshufps_avx(auVar97,auVar97,0x55);
  fVar58 = auVar61._0_4_;
  fVar69 = auVar61._4_4_;
  fVar72 = auVar61._8_4_;
  fVar75 = auVar61._12_4_;
  fVar60 = auVar39._0_4_;
  fVar71 = auVar39._4_4_;
  fVar36 = auVar39._8_4_;
  fVar37 = auVar39._12_4_;
  auVar61 = vshufps_avx(auVar44,auVar44,0x55);
  fVar53 = auVar61._0_4_;
  fVar54 = auVar61._4_4_;
  fVar55 = auVar61._8_4_;
  auVar39 = vshufps_avx(auVar80,auVar80,0x55);
  fVar56 = auVar39._0_4_;
  fVar57 = auVar39._4_4_;
  fVar52 = auVar39._8_4_;
  auVar103._0_4_ = fVar56 * local_b8 + fVar53 * local_368 + fVar60 * local_2b8 + fVar58 * local_388;
  auVar103._4_4_ =
       fVar57 * fStack_b4 + fVar54 * fStack_364 + fVar71 * fStack_2b4 + fVar69 * fStack_384;
  auVar103._8_4_ =
       fVar52 * fStack_b0 + fVar55 * fStack_360 + fVar36 * fStack_2b0 + fVar72 * fStack_380;
  auVar103._12_4_ =
       auVar39._12_4_ * fStack_ac +
       auVar61._12_4_ * fStack_35c + fVar37 * fStack_2ac + fVar75 * fStack_37c;
  auVar103._16_4_ =
       fVar56 * fStack_a8 + fVar53 * fStack_358 + fVar60 * fStack_2a8 + fVar58 * fStack_378;
  auVar103._20_4_ =
       fVar57 * fStack_a4 + fVar54 * fStack_354 + fVar71 * fStack_2a4 + fVar69 * fStack_374;
  auVar103._24_4_ =
       fVar52 * fStack_a0 + fVar55 * fStack_350 + fVar36 * fStack_2a0 + fVar72 * fStack_370;
  auVar103._28_4_ = fStack_34c + fStack_9c + 0.0;
  auVar107._0_4_ = fVar56 * local_2d8 + fVar53 * local_2f8 + fVar60 * local_248 + local_3a8 * fVar58
  ;
  auVar107._4_4_ =
       fVar57 * fStack_2d4 + fVar54 * fStack_2f4 + fVar71 * fStack_244 + fStack_3a4 * fVar69;
  auVar107._8_4_ =
       fVar52 * fStack_2d0 + fVar55 * fStack_2f0 + fVar36 * fStack_240 + fStack_3a0 * fVar72;
  auVar107._12_4_ =
       auVar39._12_4_ * fStack_2cc +
       auVar61._12_4_ * fStack_2ec + fVar37 * fStack_23c + fStack_39c * fVar75;
  auVar107._16_4_ =
       fVar56 * fStack_2c8 + fVar53 * fStack_2e8 + fVar60 * fStack_238 + fStack_398 * fVar58;
  auVar107._20_4_ =
       fVar57 * fStack_2c4 + fVar54 * fStack_2e4 + fVar71 * fStack_234 + fStack_394 * fVar69;
  auVar107._24_4_ =
       fVar52 * fStack_2c0 + fVar55 * fStack_2e0 + fVar36 * fStack_230 + fStack_390 * fVar72;
  auVar107._28_4_ = fVar37 + fVar37 + fVar37 + fVar75;
  auVar49 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,1);
  auVar18._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar18._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar18._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar18._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar18._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar18._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar18._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar18._28_4_ = auVar49._28_4_;
  auVar17 = vsubps_avx(auVar103,auVar18);
  auVar49 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
  auVar143._0_4_ = auVar103._0_4_ + auVar49._0_4_ * 0.055555556;
  auVar143._4_4_ = auVar103._4_4_ + auVar49._4_4_ * 0.055555556;
  auVar143._8_4_ = auVar103._8_4_ + auVar49._8_4_ * 0.055555556;
  auVar143._12_4_ = auVar103._12_4_ + auVar49._12_4_ * 0.055555556;
  auVar143._16_4_ = auVar103._16_4_ + auVar49._16_4_ * 0.055555556;
  auVar143._20_4_ = auVar103._20_4_ + auVar49._20_4_ * 0.055555556;
  auVar143._24_4_ = auVar103._24_4_ + auVar49._24_4_ * 0.055555556;
  auVar143._28_4_ = auVar103._28_4_ + auVar49._28_4_;
  auVar108._8_4_ = 0xff800000;
  auVar108._0_8_ = 0xff800000ff800000;
  auVar108._12_4_ = 0xff800000;
  auVar108._16_4_ = 0xff800000;
  auVar108._20_4_ = 0xff800000;
  auVar108._24_4_ = 0xff800000;
  auVar108._28_4_ = 0xff800000;
  auVar49 = vmaxps_avx(auVar108,auVar103);
  auVar13 = vmaxps_avx(auVar17,auVar143);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar61 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar61 = vunpcklps_avx(auVar40,auVar61);
  auVar40 = vshufps_avx(auVar106,auVar106,0xaa);
  auVar39 = vpermilps_avx(auVar97,0xaa);
  fVar58 = auVar40._0_4_;
  fVar69 = auVar40._4_4_;
  fVar72 = auVar40._8_4_;
  fVar75 = auVar40._12_4_;
  fVar53 = auVar39._0_4_;
  fVar54 = auVar39._4_4_;
  fVar55 = auVar39._8_4_;
  fVar56 = auVar39._12_4_;
  auVar40 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar60 = auVar40._0_4_;
  fVar71 = auVar40._4_4_;
  fVar36 = auVar40._8_4_;
  fVar37 = auVar40._12_4_;
  auVar40 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar57 = auVar40._0_4_;
  fVar52 = auVar40._4_4_;
  fVar59 = auVar40._8_4_;
  auVar68._0_4_ = fVar57 * local_b8 + fVar60 * local_368 + fVar53 * local_2b8 + fVar58 * local_388;
  auVar68._4_4_ =
       fVar52 * fStack_b4 + fVar71 * fStack_364 + fVar54 * fStack_2b4 + fVar69 * fStack_384;
  auVar68._8_4_ =
       fVar59 * fStack_b0 + fVar36 * fStack_360 + fVar55 * fStack_2b0 + fVar72 * fStack_380;
  auVar68._12_4_ =
       auVar40._12_4_ * fStack_ac + fVar37 * fStack_35c + fVar56 * fStack_2ac + fVar75 * fStack_37c;
  auVar68._16_4_ =
       fVar57 * fStack_a8 + fVar60 * fStack_358 + fVar53 * fStack_2a8 + fVar58 * fStack_378;
  auVar68._20_4_ =
       fVar52 * fStack_a4 + fVar71 * fStack_354 + fVar54 * fStack_2a4 + fVar69 * fStack_374;
  auVar68._24_4_ =
       fVar59 * fStack_a0 + fVar36 * fStack_350 + fVar55 * fStack_2a0 + fVar72 * fStack_370;
  auVar68._28_4_ = 0;
  auVar127._0_4_ = fVar57 * local_2d8 + fVar60 * local_2f8 + fVar58 * local_3a8 + fVar53 * local_248
  ;
  auVar127._4_4_ =
       fVar52 * fStack_2d4 + fVar71 * fStack_2f4 + fVar69 * fStack_3a4 + fVar54 * fStack_244;
  auVar127._8_4_ =
       fVar59 * fStack_2d0 + fVar36 * fStack_2f0 + fVar72 * fStack_3a0 + fVar55 * fStack_240;
  auVar127._12_4_ =
       auVar40._12_4_ * fStack_2cc + fVar37 * fStack_2ec + fVar75 * fStack_39c + fVar56 * fStack_23c
  ;
  auVar127._16_4_ =
       fVar57 * fStack_2c8 + fVar60 * fStack_2e8 + fVar58 * fStack_398 + fVar53 * fStack_238;
  auVar127._20_4_ =
       fVar52 * fStack_2c4 + fVar71 * fStack_2e4 + fVar69 * fStack_394 + fVar54 * fStack_234;
  auVar127._24_4_ =
       fVar59 * fStack_2c0 + fVar36 * fStack_2e0 + fVar72 * fStack_390 + fVar55 * fStack_230;
  auVar127._28_4_ = fVar37 + fVar37 + fVar75 + fVar56;
  auVar49 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,1);
  auVar19._4_4_ = auVar49._4_4_ * 0.055555556;
  auVar19._0_4_ = auVar49._0_4_ * 0.055555556;
  auVar19._8_4_ = auVar49._8_4_ * 0.055555556;
  auVar19._12_4_ = auVar49._12_4_ * 0.055555556;
  auVar19._16_4_ = auVar49._16_4_ * 0.055555556;
  auVar19._20_4_ = auVar49._20_4_ * 0.055555556;
  auVar19._24_4_ = auVar49._24_4_ * 0.055555556;
  auVar19._28_4_ = auVar49._28_4_;
  auVar18 = vsubps_avx(auVar68,auVar19);
  auVar49 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,0x80);
  auVar128._0_4_ = auVar49._0_4_ * 0.055555556 + auVar68._0_4_;
  auVar128._4_4_ = auVar49._4_4_ * 0.055555556 + auVar68._4_4_;
  auVar128._8_4_ = auVar49._8_4_ * 0.055555556 + auVar68._8_4_;
  auVar128._12_4_ = auVar49._12_4_ * 0.055555556 + auVar68._12_4_;
  auVar128._16_4_ = auVar49._16_4_ * 0.055555556 + auVar68._16_4_;
  auVar128._20_4_ = auVar49._20_4_ * 0.055555556 + auVar68._20_4_;
  auVar128._24_4_ = auVar49._24_4_ * 0.055555556 + auVar68._24_4_;
  auVar128._28_4_ = auVar49._28_4_ + 0.0;
  auVar51._8_4_ = 0xff800000;
  auVar51._0_8_ = 0xff800000ff800000;
  auVar51._12_4_ = 0xff800000;
  auVar51._16_4_ = 0xff800000;
  auVar51._20_4_ = 0xff800000;
  auVar51._24_4_ = 0xff800000;
  auVar51._28_4_ = 0xff800000;
  auVar49 = vmaxps_avx(auVar51,auVar68);
  auVar13 = vmaxps_avx(auVar18,auVar128);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar40 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar40 = vinsertps_avx(auVar61,auVar40,0x28);
  auVar49 = vminps_avx(local_1e8,_local_268);
  auVar81._8_4_ = 0x7f800000;
  auVar81._0_8_ = 0x7f8000007f800000;
  auVar81._12_4_ = 0x7f800000;
  auVar81._16_4_ = 0x7f800000;
  auVar81._20_4_ = 0x7f800000;
  auVar81._24_4_ = 0x7f800000;
  auVar81._28_4_ = 0x7f800000;
  auVar13 = vminps_avx(auVar81,auVar114);
  auVar49 = vminps_avx(auVar13,auVar49);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar61 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar49 = vminps_avx(auVar17,auVar143);
  auVar113._8_4_ = 0x5dccb9a2;
  auVar113._0_8_ = 0x5dccb9a25dccb9a2;
  auVar113._12_4_ = 0x5dccb9a2;
  auVar115 = ZEXT1664(auVar113);
  auVar13 = vminps_avx(auVar81,auVar103);
  auVar49 = vminps_avx(auVar13,auVar49);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar39 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar39 = vunpcklps_avx(auVar61,auVar39);
  auVar49 = vminps_avx(auVar18,auVar128);
  auVar117._8_4_ = 0xddccb9a2;
  auVar117._0_8_ = 0xddccb9a2ddccb9a2;
  auVar117._12_4_ = 0xddccb9a2;
  auVar119 = ZEXT1664(auVar117);
  auVar13 = vminps_avx(auVar81,auVar68);
  auVar49 = vminps_avx(auVar13,auVar49);
  auVar13 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar61 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar61 = vinsertps_avx(auVar39,auVar61,0x28);
  auVar49 = vshufps_avx(auVar16,auVar16,0xb1);
  auVar49 = vminps_avx(auVar16,auVar49);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar39 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar49 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar49 = vminps_avx(auVar47,auVar49);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar80 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar80 = vunpcklps_avx(auVar39,auVar80);
  auVar49 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar49 = vminps_avx(auVar15,auVar49);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vminps_avx(auVar49,auVar13);
  auVar39 = vminps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar39 = vinsertps_avx(auVar80,auVar39,0x28);
  auVar80 = vminps_avx(auVar61,auVar39);
  auVar49 = vshufps_avx(_local_208,_local_208,0xb1);
  auVar49 = vmaxps_avx(_local_208,auVar49);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar61 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar49 = vshufps_avx(auVar14,auVar14,0xb1);
  auVar49 = vmaxps_avx(auVar14,auVar49);
  auVar13 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar13);
  auVar39 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar39 = vunpcklps_avx(auVar61,auVar39);
  auVar49 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar49 = vmaxps_avx(auVar64,auVar49);
  auVar64 = vshufpd_avx(auVar49,auVar49,5);
  auVar49 = vmaxps_avx(auVar49,auVar64);
  auVar61 = vmaxps_avx(auVar49._0_16_,auVar49._16_16_);
  auVar61 = vinsertps_avx(auVar39,auVar61,0x28);
  auVar61 = vmaxps_avx(auVar40,auVar61);
  auVar40 = vcmpps_avx(auVar80,auVar117,6);
  auVar61 = vcmpps_avx(auVar61,auVar113,1);
  auVar40 = vandps_avx(auVar61,auVar40);
  uVar29 = vmovmskps_avx(auVar40);
  lVar32 = lVar32 + 0x38;
  if ((~(byte)uVar29 & 7) != 0) goto LAB_00bbe3f2;
  goto LAB_00bbd61d;
LAB_00bbe3f2:
  auVar89 = ZEXT1664(auVar85);
LAB_00bbe3fc:
  uVar34 = uVar34 + 1;
  goto LAB_00bbd4b3;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }